

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void duckdb::StringValueResult::AddQuotedValue(StringValueResult *result,idx_t buffer_pos)

{
  idx_t iVar1;
  undefined8 in_RAX;
  long lVar2;
  char *pcVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((result->super_ScannerResult).unquoted == false) {
    uStack_18 = CONCAT17(4,(int7)in_RAX);
    LineError::Insert(&result->current_errors,(CSVErrorType *)((long)&uStack_18 + 7),
                      &result->cur_col_id,&result->chunk_col_id,
                      &(result->super_ScannerResult).last_position,0);
  }
  iVar1 = (result->super_ScannerResult).quoted_position;
  lVar2 = (iVar1 - buffer_pos) + 2;
  pcVar3 = result->buffer_ptr + buffer_pos;
  while (((pcVar3 = pcVar3 + -1, lVar2 != 1 && ((result->ignore_empty_values & 1U) != 0)) &&
         (*pcVar3 == ' '))) {
    lVar2 = lVar2 + 1;
  }
  AddPossiblyEscapedValue
            (result,buffer_pos,result->buffer_ptr + iVar1 + 1,-lVar2,
             buffer_pos < (result->super_ScannerResult).last_position.buffer_pos + 2);
  (result->super_ScannerResult).quoted = false;
  return;
}

Assistant:

void StringValueResult::AddQuotedValue(StringValueResult &result, const idx_t buffer_pos) {
	if (!result.unquoted) {
		result.current_errors.Insert(UNTERMINATED_QUOTES, result.cur_col_id, result.chunk_col_id, result.last_position);
	}
	// remove potential empty values
	idx_t length = buffer_pos - result.quoted_position - 1;
	while (length > 0 && result.ignore_empty_values &&
	       result.buffer_ptr[result.quoted_position + 1 + length - 1] == ' ') {
		length--;
	}
	length--;
	AddPossiblyEscapedValue(result, buffer_pos, result.buffer_ptr + result.quoted_position + 1, length,
	                        buffer_pos < result.last_position.buffer_pos + 2);
	result.quoted = false;
}